

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O1

void __thiscall Sound_Queue::Sound_Queue(Sound_Queue *this)

{
  this->bufs = (sample_t *)0x0;
  this->free_sem = (SDL_sem *)0x0;
  this->write_buf = 0;
  this->write_pos = 0;
  this->read_buf = 0;
  this->sound_open = false;
  return;
}

Assistant:

Sound_Queue::Sound_Queue()
{
	bufs = NULL;
	free_sem = NULL;
	write_buf = 0;
	write_pos = 0;
	read_buf = 0;
	sound_open = false;
}